

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsTextItem::mouseReleaseEvent(QGraphicsTextItem *this,QGraphicsSceneMouseEvent *event)

{
  char cVar1;
  QFlagsStorage<Qt::TextInteractionFlag> QVar2;
  QFlagsStorage<Qt::MouseButton> QVar3;
  MouseButtons MVar4;
  TextInteractionFlags TVar5;
  MouseButton button;
  QWidget *widget;
  QWidgetPrivate *this_00;
  long in_FS_OFFSET;
  QPointF local_48 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)(*(long *)(this + 0x20) + 0x2c) != '\x01') {
    widget = QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
    if (widget != (QWidget *)0x0) {
      TVar5 = QWidgetTextControl::textInteractionFlags
                        ((QWidgetTextControl *)**(undefined8 **)(this + 0x20));
      if (((uint)TVar5.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                 super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) != 0) {
        (**(code **)(*(long *)this + 0x60))(local_48,this);
        QGraphicsSceneMouseEvent::pos(event);
        cVar1 = QRectF::contains(local_48);
        if (cVar1 != '\0') {
          this_00 = qt_widget_private(widget);
          button = QGraphicsSceneMouseEvent::button(event);
          QWidgetPrivate::handleSoftwareInputPanel
                    (this_00,button,(bool)(*(byte *)(*(long *)(this + 0x20) + 0x2e) & 1));
        }
      }
    }
    *(byte *)(*(long *)(this + 0x20) + 0x2e) = *(byte *)(*(long *)(this + 0x20) + 0x2e) & 0xfe;
    QGraphicsTextItemPrivate::sendControlEvent
              (*(QGraphicsTextItemPrivate **)(this + 0x20),(QEvent *)event);
    goto LAB_0057e49b;
  }
  QGraphicsItem::mouseReleaseEvent((QGraphicsItem *)(this + 0x10),event);
  QVar2.i = (Int)QWidgetTextControl::textInteractionFlags
                           ((QWidgetTextControl *)**(undefined8 **)(this + 0x20));
  if ((QFlagsStorage<Qt::TextInteractionFlag>)QVar2.i == (QFlagsStorage<Qt::TextInteractionFlag>)0x0
     ) {
    QVar3.i = (Int)QGraphicsSceneMouseEvent::buttons(event);
    if ((QFlagsStorage<Qt::MouseButton>)QVar3.i != (QFlagsStorage<Qt::MouseButton>)0x0)
    goto LAB_0057e3f1;
  }
  else {
LAB_0057e3f1:
    MVar4 = QGraphicsSceneMouseEvent::buttons(event);
    if (((uint)MVar4.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
               super_QFlagsStorage<Qt::MouseButton>.i & 1) != 0) goto LAB_0057e49b;
  }
  *(undefined1 *)(*(long *)(this + 0x20) + 0x2c) = 0;
LAB_0057e49b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsTextItem::mouseReleaseEvent(QGraphicsSceneMouseEvent *event)
{
    if (dd->useDefaultImpl) {
        QGraphicsItem::mouseReleaseEvent(event);
        if (dd->control->textInteractionFlags() == Qt::NoTextInteraction
            && !event->buttons()) {
            // User released last button on non-interactive item.
            dd->useDefaultImpl = false;
        } else  if ((event->buttons() & Qt::LeftButton) == 0) {
            // User released the left button on an interactive item.
            dd->useDefaultImpl = false;
        }
        return;
    }

    QWidget *widget = event->widget();
    if (widget && (dd->control->textInteractionFlags() & Qt::TextEditable) && boundingRect().contains(event->pos())) {
        qt_widget_private(widget)->handleSoftwareInputPanel(event->button(), dd->clickCausedFocus);
    }
    dd->clickCausedFocus = 0;
    dd->sendControlEvent(event);
}